

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmContinue(ExpressionContext *ctx,VmModule *module,ExprContinue *node)

{
  VmBlock *label;
  VmValue *pVVar1;
  
  if (node->closures != (ExprBase *)0x0) {
    CompileVm(ctx,module,node->closures);
  }
  label = GetLoopContinueBlock(module,*(uint *)&(node->super_ExprBase).field_0x2c);
  anon_unknown.dwarf_f89de::CreateJump(module,(node->super_ExprBase).source,&label->super_VmValue);
  pVVar1 = anon_unknown.dwarf_f89de::CreateVoid(module);
  pVVar1 = anon_unknown.dwarf_f89de::CheckType(ctx,&node->super_ExprBase,pVVar1);
  return pVVar1;
}

Assistant:

VmValue* CompileVmContinue(ExpressionContext &ctx, VmModule *module, ExprContinue *node)
{
	if(node->closures)
		CompileVm(ctx, module, node->closures);

	VmBlock *target = GetLoopContinueBlock(module, node->depth);

	CreateJump(module, node->source, target);

	return CheckType(ctx, node, CreateVoid(module));
}